

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O0

void print_usage(void)

{
  printf("Usage: [options] [mode] inpath/infile [outfile]\n");
  printf("\n");
  printf("Modes:\n");
  printf("c - Compress \"infile\" to \"outfile\"\n");
  printf("d - Decompress \"infile\" to \"outfile\"\n");
  printf("a - Recursively compress all files under \"inpath\"\n");
  printf("\n");
  printf("Options:\n");
  printf("-m[0-4] - Compression level: 0=fastest, 1=faster, 2=default, 3=better, 4=uber\n");
  printf("          Default is uber (4).\n");
  printf("-d[15-29] - Set log2 dictionary size, max. is 26 on x86 platforms, 29 on x64.\n");
  printf("          Default is 26 (64MB) on x86, 28 (256MB) on x64.\n");
  printf("-c - Do not compute or verify adler32 checksum during decompression (faster).\n");
  printf("-u - Use unbuffered decompression on files that can fit into memory.\n");
  printf("     Unbuffered decompression is faster, but may have more I/O overhead.\n");
  printf("-t[0-64] - Number of extra compression helper threads. Default=# CPU\'s-1.\n");
  printf("           Note: The total number of threads will be 1 + num_helper_threads,\n");
  printf("           because the main thread is counted separately.\n");
  printf("-v - Immediately decompress compressed file after compression for verification.\n");
  printf("-x - Extreme parsing, for slight compression gain (Uber only, MUCH slower).\n");
  printf("-x# - Same as -x, except sets the max # of best arrivals (%u-%u), higher=better compression\n"
         ,2,8);
  printf("-o - Permit the compressor to trade off decompression rate for higher ratios.\n");
  printf("     Note: This flag can drop the decompression rate by 30%% or more.\n");
  printf("-e - Enable deterministic parsing for slightly higher compression and\n");
  printf("     predictable output files when enabled, but less scalability.\n");
  printf("     The default is disabled, so the generated output data may slightly vary\n");
  printf("     between runs when multithreaded compression is enabled.\n");
  printf("-afilename Enable delta compression using the specified seed file.\n");
  printf("           The same seed file MUST be used for compression/decompression.\n");
  printf("-r - Use randomized parameters for each file.\n");
  printf("-h[0-%u] - Set Huffman table update frequency. 0=Internal def, Def=%u, higher=faster.\n",
         0x14,8);
  printf(" Lower settings=slower decompression, but higher ratio. Note 1=impractically slow.\n");
  printf("-b - Force single threaded parsing for higher compression ratios (slower).\n");
  printf("-F - Use low memory hash finder (16-bit vs. 24-bit hashing)\n");
  printf("-f# - Set extreme parser\'s \"fast bytes\" setting (16-257, default=128, lower=faster)\n")
  ;
  return;
}

Assistant:

static void print_usage()
{
   printf("Usage: [options] [mode] inpath/infile [outfile]\n");
   printf("\n");
   printf("Modes:\n");
   printf("c - Compress \"infile\" to \"outfile\"\n");
   printf("d - Decompress \"infile\" to \"outfile\"\n");
   printf("a - Recursively compress all files under \"inpath\"\n");
   printf("\n");
   printf("Options:\n");
   printf("-m[0-4] - Compression level: 0=fastest, 1=faster, 2=default, 3=better, 4=uber\n");
   printf("          Default is uber (4).\n");
   printf("-d[15-29] - Set log2 dictionary size, max. is 26 on x86 platforms, 29 on x64.\n");
   printf("          Default is 26 (64MB) on x86, 28 (256MB) on x64.\n");
   printf("-c - Do not compute or verify adler32 checksum during decompression (faster).\n");
   printf("-u - Use unbuffered decompression on files that can fit into memory.\n");
   printf("     Unbuffered decompression is faster, but may have more I/O overhead.\n");
   printf("-t[0-64] - Number of extra compression helper threads. Default=# CPU's-1.\n");
   printf("           Note: The total number of threads will be 1 + num_helper_threads,\n");
   printf("           because the main thread is counted separately.\n");
   printf("-v - Immediately decompress compressed file after compression for verification.\n");
   printf("-x - Extreme parsing, for slight compression gain (Uber only, MUCH slower).\n");
   printf("-x# - Same as -x, except sets the max # of best arrivals (%u-%u), higher=better compression\n", LZHAM_EXTREME_PARSING_MAX_BEST_ARRIVALS_MIN, LZHAM_EXTREME_PARSING_MAX_BEST_ARRIVALS_MAX);
   printf("-o - Permit the compressor to trade off decompression rate for higher ratios.\n");
   printf("     Note: This flag can drop the decompression rate by 30%% or more.\n");
   printf("-e - Enable deterministic parsing for slightly higher compression and\n");
   printf("     predictable output files when enabled, but less scalability.\n");
   printf("     The default is disabled, so the generated output data may slightly vary\n");
   printf("     between runs when multithreaded compression is enabled.\n");
   printf("-afilename Enable delta compression using the specified seed file.\n");
   printf("           The same seed file MUST be used for compression/decompression.\n");
   printf("-r - Use randomized parameters for each file.\n");
	printf("-h[0-%u] - Set Huffman table update frequency. 0=Internal def, Def=%u, higher=faster.\n", LZHAM_FASTEST_TABLE_UPDATE_RATE, LZHAM_DEFAULT_TABLE_UPDATE_RATE);
	printf(" Lower settings=slower decompression, but higher ratio. Note 1=impractically slow.\n");
   printf("-b - Force single threaded parsing for higher compression ratios (slower).\n");
   printf("-F - Use low memory hash finder (16-bit vs. 24-bit hashing)\n");
   printf("-f# - Set extreme parser's \"fast bytes\" setting (16-257, default=128, lower=faster)\n");
}